

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O3

int mbedtls_sha1_finish(mbedtls_sha1_context *ctx,uchar *output)

{
  uchar *data;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = ctx->total[0] & 0x3f;
  data = ctx->buffer;
  ctx->buffer[uVar3] = 0x80;
  if (uVar3 < 0x38) {
    switchD_01043a80::default(ctx->buffer + (ulong)uVar3 + 1,0,(ulong)(0x37 - uVar3));
  }
  else {
    switchD_01043a80::default(ctx->buffer + (ulong)uVar3 + 1,0,(ulong)(uVar3 ^ 0x3f));
    mbedtls_internal_sha1_process(ctx,data);
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
    ctx->buffer[8] = '\0';
    ctx->buffer[9] = '\0';
    ctx->buffer[10] = '\0';
    ctx->buffer[0xb] = '\0';
    ctx->buffer[0xc] = '\0';
    ctx->buffer[0xd] = '\0';
    ctx->buffer[0xe] = '\0';
    ctx->buffer[0xf] = '\0';
    ctx->buffer[0x10] = '\0';
    ctx->buffer[0x11] = '\0';
    ctx->buffer[0x12] = '\0';
    ctx->buffer[0x13] = '\0';
    ctx->buffer[0x14] = '\0';
    ctx->buffer[0x15] = '\0';
    ctx->buffer[0x16] = '\0';
    ctx->buffer[0x17] = '\0';
    ctx->buffer[0x18] = '\0';
    ctx->buffer[0x19] = '\0';
    ctx->buffer[0x1a] = '\0';
    ctx->buffer[0x1b] = '\0';
    ctx->buffer[0x1c] = '\0';
    ctx->buffer[0x1d] = '\0';
    ctx->buffer[0x1e] = '\0';
    ctx->buffer[0x1f] = '\0';
    ctx->buffer[0x20] = '\0';
    ctx->buffer[0x21] = '\0';
    ctx->buffer[0x22] = '\0';
    ctx->buffer[0x23] = '\0';
    ctx->buffer[0x24] = '\0';
    ctx->buffer[0x25] = '\0';
    ctx->buffer[0x26] = '\0';
    ctx->buffer[0x27] = '\0';
    ctx->buffer[0x28] = '\0';
    ctx->buffer[0x29] = '\0';
    ctx->buffer[0x2a] = '\0';
    ctx->buffer[0x2b] = '\0';
    ctx->buffer[0x2c] = '\0';
    ctx->buffer[0x2d] = '\0';
    ctx->buffer[0x2e] = '\0';
    ctx->buffer[0x2f] = '\0';
    ctx->buffer[0x30] = '\0';
    ctx->buffer[0x31] = '\0';
    ctx->buffer[0x32] = '\0';
    ctx->buffer[0x33] = '\0';
    ctx->buffer[0x34] = '\0';
    ctx->buffer[0x35] = '\0';
    ctx->buffer[0x36] = '\0';
    ctx->buffer[0x37] = '\0';
  }
  uVar3 = ctx->total[0];
  uVar1 = ctx->total[1] << 3;
  uVar2 = uVar3 << 3;
  *(uint *)(ctx->buffer + 0x38) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
       (uVar1 | uVar3 >> 0x1d) << 0x18;
  *(uint *)(ctx->buffer + 0x3c) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar3 << 0x1b;
  mbedtls_internal_sha1_process(ctx,data);
  uVar3 = ctx->state[0];
  *(uint *)output = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = ctx->state[1];
  *(uint *)(output + 4) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = ctx->state[2];
  *(uint *)(output + 8) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = ctx->state[3];
  *(uint *)(output + 0xc) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = ctx->state[4];
  *(uint *)(output + 0x10) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  mbedtls_platform_zeroize(ctx,0x5c);
  return 0;
}

Assistant:

int mbedtls_sha1_finish(mbedtls_sha1_context *ctx,
                        unsigned char output[20])
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t used;
    uint32_t high, low;

    /*
     * Add padding: 0x80 then 0x00 until 8 bytes remain for the length
     */
    used = ctx->total[0] & 0x3F;

    ctx->buffer[used++] = 0x80;

    if (used <= 56) {
        /* Enough room for padding + length in current block */
        memset(ctx->buffer + used, 0, 56 - used);
    } else {
        /* We'll need an extra block */
        memset(ctx->buffer + used, 0, 64 - used);

        if ((ret = mbedtls_internal_sha1_process(ctx, ctx->buffer)) != 0) {
            goto exit;
        }

        memset(ctx->buffer, 0, 56);
    }

    /*
     * Add message length
     */
    high = (ctx->total[0] >> 29)
           | (ctx->total[1] <<  3);
    low  = (ctx->total[0] <<  3);

    MBEDTLS_PUT_UINT32_BE(high, ctx->buffer, 56);
    MBEDTLS_PUT_UINT32_BE(low,  ctx->buffer, 60);

    if ((ret = mbedtls_internal_sha1_process(ctx, ctx->buffer)) != 0) {
        goto exit;
    }

    /*
     * Output final state
     */
    MBEDTLS_PUT_UINT32_BE(ctx->state[0], output,  0);
    MBEDTLS_PUT_UINT32_BE(ctx->state[1], output,  4);
    MBEDTLS_PUT_UINT32_BE(ctx->state[2], output,  8);
    MBEDTLS_PUT_UINT32_BE(ctx->state[3], output, 12);
    MBEDTLS_PUT_UINT32_BE(ctx->state[4], output, 16);

    ret = 0;

exit:
    mbedtls_sha1_free(ctx);
    return ret;
}